

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_note.cpp
# Opt level: O2

void __thiscall BmsNoteManager::AllScratch(BmsNoteManager *this,int seed,int sc,int s,int e)

{
  _Rb_tree_color bar;
  int iVar1;
  int iVar2;
  _Base_ptr p_Var3;
  vector<int,_std::allocator<int>_> channels;
  set<int,_std::less<int>,_std::allocator<int>_> notemap;
  int local_b0;
  int local_ac;
  _Vector_base<int,_std::allocator<int>_> local_a8;
  BmsNoteLane *local_90;
  _Rb_tree_node_base *local_88;
  BmsNote local_80;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  local_ac = s;
  srand(seed);
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  GetNoteExistBar(this,(set<int,_std::less<int>,_std::allocator<int>_> *)&local_60);
  local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90 = this->lanes_ + sc;
  p_Var3 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  while ((_Rb_tree_header *)p_Var3 != &local_60._M_impl.super__Rb_tree_header) {
    bar = p_Var3[1]._M_color;
    local_88 = p_Var3;
    BmsNoteLane::Get(&local_80,this->lanes_,bar);
    iVar2 = local_80.type;
    BmsWord::~BmsWord(&local_80.value);
    iVar1 = local_ac;
    if (iVar2 == 0) {
      while (local_b0 = iVar1, iVar1 <= e) {
        if (iVar1 != sc) {
          BmsNoteLane::Get(&local_80,this->lanes_ + iVar1,bar);
          iVar2 = local_80.type;
          BmsWord::~BmsWord(&local_80.value);
          if (iVar2 == 1) {
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)&local_a8,&local_b0);
          }
        }
        iVar1 = local_b0 + 1;
      }
      iVar2 = rand();
      iVar2 = local_a8._M_impl.super__Vector_impl_data._M_start
              [(ulong)(long)iVar2 %
               (ulong)((long)local_a8._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_a8._M_impl.super__Vector_impl_data._M_start >> 2)];
      BmsNoteLane::Get(&local_80,this->lanes_ + iVar2,bar);
      BmsNoteLane::Set(local_90,bar,&local_80);
      BmsWord::~BmsWord(&local_80.value);
      BmsNoteLane::Delete(this->lanes_ + iVar2,bar);
      if (local_a8._M_impl.super__Vector_impl_data._M_finish !=
          local_a8._M_impl.super__Vector_impl_data._M_start) {
        local_a8._M_impl.super__Vector_impl_data._M_finish =
             local_a8._M_impl.super__Vector_impl_data._M_start;
      }
    }
    p_Var3 = (_Base_ptr)std::_Rb_tree_increment(local_88);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_a8);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_60);
  return;
}

Assistant:

void BmsNoteManager::AllScratch(int seed, int sc, int s, int e) {
	// get a note randomly from column
	srand(seed);
	std::set<barindex> notemap;
	GetNoteExistBar(notemap);
	std::vector<int> channels;
	for (auto it = notemap.begin(); it != notemap.end(); ++it) {
		barindex bar = *it;
		// SP
		if (lanes_[0].Get(bar).type == BmsNote::NOTE_NONE) {
			// find available note list
			for (int c = s; c <= e; c++) if (c != sc) {
				switch (lanes_[c].Get(bar).type) {
				case BmsNote::NOTE_NORMAL:
					channels.push_back(c);
				}
			}
			// push scratch from available note list
			int nc = channels[rand() % channels.size()];
			lanes_[sc].Set(bar, lanes_[nc].Get(bar));
			lanes_[nc].Delete(bar);
			channels.clear();
		}
	}
}